

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::anon_unknown_1::StringToBool
               (string *value,bool *result)

{
  bool bVar1;
  bool bVar2;
  string upper_value;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)value);
  UpperString(&local_30);
  bVar1 = std::operator==(&local_30,"NO");
  if (bVar1) {
    bVar2 = false;
  }
  else {
    bVar1 = std::operator==(&local_30,"YES");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = false;
      goto LAB_002ac5b2;
    }
  }
  *result = bVar2;
  bVar1 = true;
LAB_002ac5b2:
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool StringToBool(const std::string& value, bool* result) {
  std::string upper_value(value);
  UpperString(&upper_value);
  if (upper_value == "NO") {
    *result = false;
    return true;
  }
  if (upper_value == "YES") {
    *result = true;
    return true;
  }

  return false;
}